

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureWeight::Clear
          (BayesianProbitRegressor_FeatureWeight *this)

{
  uint32_t cached_has_bits;
  BayesianProbitRegressor_FeatureWeight *this_local;
  
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight>::Clear
            (&this->weights_);
  this->featureid_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor_FeatureWeight::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.BayesianProbitRegressor.FeatureWeight)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  weights_.Clear();
  featureid_ = 0u;
  _internal_metadata_.Clear<std::string>();
}